

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

uint __thiscall tonk::SessionOutgoing::getPacketNumBytes(SessionOutgoing *this,int32_t packetNum)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (this->ShouldCompressSequenceNumbers == true) {
    uVar2 = packetNum - (this->LastAck).PeerNextExpectedSeqNum;
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    uVar3 = packetNum - this->NextSequenceNumber;
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    if (uVar2 < uVar1) {
      uVar2 = uVar1;
    }
    if (uVar2 < 0x7fff) {
      return 2 - (uVar2 < 0x7f);
    }
  }
  return 3;
}

Assistant:

unsigned SessionOutgoing::getPacketNumBytes(int32_t packetNum) const
{
    TONK_UNUSED(packetNum);

#ifdef TONK_ENABLE_SEQNO_COMPRESSION
    if (ShouldCompressSequenceNumbers)
    {
        // The peer uses its next expected sequence number to decompress the
        // numbers we send.  By the time a new datagram arrives, that number
        // may have advanced from that last one acknowledged through the last
        // one that was sent.  When sending a new sequence number, include
        // enough bits so that any possible number can decode the new one.
        // So, take the larger of the distances from each end.
        int32_t mag = (int32_t)packetNum - (int32_t)LastAck.PeerNextExpectedSeqNum;
        if (mag < 0) {
            mag = -mag;
        }
        TONK_DEBUG_ASSERT(mag < 0x800000);
        int32_t mag2 = (int32_t)packetNum - (int32_t)NextSequenceNumber;
        if (mag2 < 0) {
            mag2 = -mag2;
        }
        TONK_DEBUG_ASSERT(mag2 < 0x800000);
        if (mag < mag2) {
            mag = mag2;
        }
        // Add one to handle ambiguity due to two's complement negatives
        // having one more value of precision than positive numbers
        ++mag;

        // Choose the number of bytes to send:
        if (mag < 0x80) {
            return 1;
        }
        else if (mag < 0x8000) {
            return 2;
        }
    }
#endif // TONK_ENABLE_SEQNO_COMPRESSION

    return 3;
}